

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void av1_write_last_tile_info
               (AV1_COMP *cpi,FrameHeaderInfo *fh_info,aom_write_bit_buffer *saved_wb,
               size_t *curr_tg_data_size,uint8_t *curr_tg_start,uint32_t *total_size,
               uint8_t **tile_data_start,int *largest_tile_id,int *is_first_tg,
               uint32_t obu_header_size,uint8_t obu_extn_header)

{
  _Bool _Var1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  uint64_t value;
  uint8_t *dest;
  
  value = *curr_tg_data_size - (ulong)obu_header_size;
  sVar4 = aom_uleb_size_in_bytes(value);
  dest = curr_tg_start + obu_header_size;
  memmove(dest + sVar4,dest,value);
  iVar3 = av1_write_uleb_obu_size_unsafe(value,dest);
  if (iVar3 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,
                       "av1_write_last_tile_info: output buffer full");
  }
  sVar2 = *curr_tg_data_size;
  *curr_tg_data_size = sVar2 + sVar4;
  *total_size = *total_size + (int)sVar4;
  *tile_data_start = *tile_data_start + sVar4;
  if (cpi->num_tg == 1) {
    saved_wb->bit_buffer = saved_wb->bit_buffer + sVar4;
  }
  if ((*is_first_tg == 0) && ((cpi->common).features.error_resilient_mode == true)) {
    memmove(curr_tg_start + fh_info->total_length,curr_tg_start,sVar2 + sVar4);
    memcpy(curr_tg_start,fh_info->frame_header,fh_info->total_length);
    *largest_tile_id = 0;
    _Var1 = ((cpi->common).seq_params)->has_nonzero_operating_point_idc;
    sVar4 = fh_info->obu_header_byte_offset;
    curr_tg_start[sVar4] = _Var1 * '\x04' | 0x3a;
    if (_Var1 == true) {
      curr_tg_start[sVar4 + 1] = obu_extn_header;
    }
    *curr_tg_data_size = *curr_tg_data_size + fh_info->total_length;
    *total_size = *total_size + (int)fh_info->total_length;
  }
  *is_first_tg = 0;
  return;
}

Assistant:

void av1_write_last_tile_info(
    AV1_COMP *const cpi, const FrameHeaderInfo *fh_info,
    struct aom_write_bit_buffer *saved_wb, size_t *curr_tg_data_size,
    uint8_t *curr_tg_start, uint32_t *const total_size,
    uint8_t **tile_data_start, int *const largest_tile_id,
    int *const is_first_tg, uint32_t obu_header_size, uint8_t obu_extn_header) {
  // write current tile group size
  const size_t obu_payload_size = *curr_tg_data_size - obu_header_size;
  const size_t length_field_size =
      obu_memmove_unsafe(obu_header_size, obu_payload_size, curr_tg_start);
  if (av1_write_uleb_obu_size_unsafe(
          obu_payload_size, curr_tg_start + obu_header_size) != AOM_CODEC_OK) {
    aom_internal_error(cpi->common.error, AOM_CODEC_ERROR,
                       "av1_write_last_tile_info: output buffer full");
  }
  *curr_tg_data_size += length_field_size;
  *total_size += (uint32_t)length_field_size;
  *tile_data_start += length_field_size;
  if (cpi->num_tg == 1) {
    // if this tg is combined with the frame header then update saved
    // frame header base offset according to length field size
    saved_wb->bit_buffer += length_field_size;
  }

  if (!(*is_first_tg) && cpi->common.features.error_resilient_mode) {
    // Make room for a duplicate Frame Header OBU.
    memmove(curr_tg_start + fh_info->total_length, curr_tg_start,
            *curr_tg_data_size);

    // Insert a copy of the Frame Header OBU.
    memcpy(curr_tg_start, fh_info->frame_header, fh_info->total_length);

    // Force context update tile to be the first tile in error
    // resilient mode as the duplicate frame headers will have
    // context_update_tile_id set to 0
    *largest_tile_id = 0;

    // Rewrite the OBU header to change the OBU type to Redundant Frame
    // Header.
    av1_write_obu_header(
        &cpi->ppi->level_params, &cpi->frame_header_count,
        OBU_REDUNDANT_FRAME_HEADER,
        cpi->common.seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/true, obu_extn_header,
        &curr_tg_start[fh_info->obu_header_byte_offset]);

    *curr_tg_data_size += fh_info->total_length;
    *total_size += (uint32_t)fh_info->total_length;
  }
  *is_first_tg = 0;
}